

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O3

bool __thiscall
lan::db::set_bit<bool>
          (db *this,db_bit *context,db_bit *var,string *name,db_bit_type type,bool value)

{
  pointer pcVar1;
  void *pvVar2;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + name->_M_string_length);
  db_bit::~db_bit(var);
  std::__cxx11::string::_M_assign((string *)var);
  var->type = type;
  var->con = context;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pvVar2 = operator_new(1);
  *(bool *)pvVar2 = value;
  var->data = pvVar2;
  return true;
}

Assistant:

bool set_bit(db_bit * context, db_bit * var,std::string const name, db_bit_type const type, any const value){
            set_bit(context, var, name, type);
            var->data = new any (value);
            return (var->data);
        }